

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix.hpp
# Opt level: O1

type __thiscall
LazyFunction<Length_impl,Arg<1ul>,Nothing,Nothing,Nothing>::operator()
          (LazyFunction<Length_impl,Arg<1ul>,Nothing,Nothing,Nothing> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  pointer pcVar1;
  undefined1 *local_30;
  type local_28;
  undefined1 local_20 [16];
  
  pcVar1 = (t->_M_dataplus)._M_p;
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char*>((string *)&local_30,pcVar1,pcVar1 + t->_M_string_length)
  ;
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return local_28;
}

Assistant:

Arg(){}